

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_test.c
# Opt level: O0

int dbg_emitter(void *emit_context,flatcc_iovec_t *iov,int iov_count,flatbuffers_soffset_t offset,
               size_t len)

{
  int local_2c;
  int i;
  size_t len_local;
  flatbuffers_soffset_t offset_local;
  int iov_count_local;
  flatcc_iovec_t *iov_local;
  void *emit_context_local;
  
  printf("dbg: emit: iov_count: %d, offset: %ld, len: %ld\n",(ulong)(uint)iov_count,(long)offset,len
        );
  len_local._0_4_ = offset;
  for (local_2c = 0; local_2c < iov_count; local_2c = local_2c + 1) {
    if ((uint8_t *)iov[local_2c].iov_base == "") {
      printf("dbg:  padding at: %ld, len: %ld\n",(long)(flatbuffers_soffset_t)len_local,
             iov[local_2c].iov_len);
    }
    if (iov[local_2c].iov_base == (void *)0x0) {
      printf("dbg:  null vector reserved at: %ld, len: %ld\n",(long)(flatbuffers_soffset_t)len_local
             ,iov[local_2c].iov_len);
    }
    len_local._0_4_ = (int)iov[local_2c].iov_len + (flatbuffers_soffset_t)len_local;
  }
  return 0;
}

Assistant:

int dbg_emitter(void *emit_context,
        const flatcc_iovec_t *iov, int iov_count,
        flatbuffers_soffset_t offset, size_t len)
{
    int i;

    (void)emit_context;

    printf("dbg: emit: iov_count: %d, offset: %ld, len: %ld\n",
            (int)iov_count, (long)offset, (long)len);

    for (i = 0; i < iov_count; ++i) {
        if (iov[i].iov_base == flatcc_builder_padding_base) {
            printf("dbg:  padding at: %ld, len: %ld\n",
                    (long)offset, (long)iov[i].iov_len);
        }
        if (iov[i].iov_base == 0) {
            printf("dbg:  null vector reserved at: %ld, len: %ld\n",
                    (long)offset, (long)iov[i].iov_len);
        }
        offset += (flatbuffers_soffset_t)iov[i].iov_len;
    }
    return 0;
}